

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# apply-names.cc
# Opt level: O2

Result wabt::ApplyNames(Module *module)

{
  pointer ppFVar1;
  Module *this;
  pointer ppGVar2;
  pointer ppEVar3;
  Export *pEVar4;
  pointer ppEVar5;
  ElemSegment *pEVar6;
  Var *pVVar7;
  pointer ppDVar8;
  DataSegment *pDVar9;
  Result RVar10;
  Index IVar11;
  Table *pTVar12;
  Memory *pMVar13;
  Var *pVVar14;
  size_t i_1;
  size_t i_3;
  Var *pVVar15;
  size_t i;
  ulong uVar16;
  string_view name;
  string_view name_00;
  undefined1 local_d0 [8];
  NameApplier applier;
  
  local_d0 = (undefined1  [8])&PTR__NameApplier_013e0bb0;
  applier.super_DelegateNop.super_Delegate._vptr_Delegate = (Delegate)(_func_int **)0x0;
  applier.module_ = (Module *)0x0;
  ExprVisitor::ExprVisitor((ExprVisitor *)&applier.current_func_,(Delegate *)local_d0);
  applier.labels_.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  applier.labels_.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  applier.param_and_local_index_to_name_.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  applier.param_and_local_index_to_name_.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  applier.visitor_.expr_iter_stack_.
  super__Vector_base<wabt::intrusive_list<wabt::Expr>::iterator,_std::allocator<wabt::intrusive_list<wabt::Expr>::iterator>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  applier.param_and_local_index_to_name_.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  applier.labels_.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage._4_4_ = Error;
  applier.super_DelegateNop.super_Delegate._vptr_Delegate = (Delegate)(Delegate)module;
  for (uVar16 = 0;
      ppFVar1 = (module->funcs).super__Vector_base<wabt::Func_*,_std::allocator<wabt::Func_*>_>.
                _M_impl.super__Vector_impl_data._M_start,
      uVar16 < (ulong)((long)(module->funcs).
                             super__Vector_base<wabt::Func_*,_std::allocator<wabt::Func_*>_>._M_impl
                             .super__Vector_impl_data._M_finish - (long)ppFVar1 >> 3);
      uVar16 = uVar16 + 1) {
    this = (Module *)ppFVar1[uVar16];
    applier.module_ = this;
    if ((((FuncDeclaration *)&this->name)->has_func_type == true) &&
       (RVar10 = anon_unknown_7::NameApplier::UseNameForFuncTypeVar
                           ((NameApplier *)local_d0,&((FuncDeclaration *)&this->name)->type_var),
       RVar10.enum_ == Error)) goto LAB_00d77f94;
    IVar11 = Func::GetNumParamsAndLocals((Func *)this);
    MakeTypeBindingReverseMapping
              ((ulong)IVar11,(BindingHash *)&this->imports,
               (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *)&applier.visitor_.expr_iter_stack_.
                   super__Vector_base<wabt::intrusive_list<wabt::Expr>::iterator,_std::allocator<wabt::intrusive_list<wabt::Expr>::iterator>_>
                   ._M_impl.super__Vector_impl_data._M_end_of_storage);
    RVar10 = ExprVisitor::VisitFunc((ExprVisitor *)&applier.current_func_,(Func *)this);
    if (RVar10.enum_ == Error) goto LAB_00d77f94;
    applier.module_ = (Module *)0x0;
  }
  uVar16 = 0;
  while (ppGVar2 = (module->globals).
                   super__Vector_base<wabt::Global_*,_std::allocator<wabt::Global_*>_>._M_impl.
                   super__Vector_impl_data._M_start,
        uVar16 < (ulong)((long)(module->globals).
                               super__Vector_base<wabt::Global_*,_std::allocator<wabt::Global_*>_>.
                               _M_impl.super__Vector_impl_data._M_finish - (long)ppGVar2 >> 3)) {
    RVar10 = ExprVisitor::VisitExprList
                       ((ExprVisitor *)&applier.current_func_,&ppGVar2[uVar16]->init_expr);
    uVar16 = uVar16 + 1;
    if (RVar10.enum_ == Error) goto LAB_00d77f94;
  }
  for (uVar16 = 0;
      ppEVar3 = (module->exports).
                super__Vector_base<wabt::Export_*,_std::allocator<wabt::Export_*>_>._M_impl.
                super__Vector_impl_data._M_start,
      uVar16 < (ulong)((long)(module->exports).
                             super__Vector_base<wabt::Export_*,_std::allocator<wabt::Export_*>_>.
                             _M_impl.super__Vector_impl_data._M_finish - (long)ppEVar3 >> 3);
      uVar16 = uVar16 + 1) {
    pEVar4 = ppEVar3[uVar16];
    if (pEVar4->kind == First) {
      anon_unknown_7::NameApplier::UseNameForFuncVar((NameApplier *)local_d0,&pEVar4->var);
    }
  }
  pVVar15 = (Var *)0x0;
  while( true ) {
    ppEVar5 = (module->elem_segments).
              super__Vector_base<wabt::ElemSegment_*,_std::allocator<wabt::ElemSegment_*>_>._M_impl.
              super__Vector_impl_data._M_start;
    pVVar14 = (Var *)((long)(module->elem_segments).
                            super__Vector_base<wabt::ElemSegment_*,_std::allocator<wabt::ElemSegment_*>_>
                            ._M_impl.super__Vector_impl_data._M_finish - (long)ppEVar5 >> 3);
    if (pVVar14 <= pVVar15) break;
    pEVar6 = ppEVar5[(long)pVVar15];
    pTVar12 = Module::GetTable((Module *)applier.super_DelegateNop.super_Delegate._vptr_Delegate,
                               &pEVar6->table_var);
    if (pTVar12 == (Table *)0x0) goto LAB_00d77f94;
    name.size_ = (size_type)&pEVar6->table_var;
    name.data_ = (char *)(pTVar12->name)._M_string_length;
    anon_unknown_7::NameApplier::UseNameForVar
              ((NameApplier *)(pTVar12->name)._M_dataplus._M_p,name,pVVar14);
    RVar10 = ExprVisitor::VisitExprList((ExprVisitor *)&applier.current_func_,&pEVar6->offset);
    if (RVar10.enum_ == Error) goto LAB_00d77f94;
    pVVar14 = (pEVar6->vars).super__Vector_base<wabt::Var,_std::allocator<wabt::Var>_>._M_impl.
              super__Vector_impl_data._M_start;
    pVVar7 = *(pointer *)
              ((long)&(pEVar6->vars).super__Vector_base<wabt::Var,_std::allocator<wabt::Var>_>.
                      _M_impl + 8);
    while (pVVar14 != pVVar7) {
      RVar10 = anon_unknown_7::NameApplier::UseNameForFuncVar((NameApplier *)local_d0,pVVar14);
      pVVar14 = pVVar14 + 1;
      if (RVar10.enum_ == Error) goto LAB_00d77f94;
    }
    pVVar15 = (Var *)((long)&(pVVar15->loc).filename.data_ + 1);
  }
  pVVar15 = (Var *)0x0;
  do {
    ppDVar8 = (module->data_segments).
              super__Vector_base<wabt::DataSegment_*,_std::allocator<wabt::DataSegment_*>_>._M_impl.
              super__Vector_impl_data._M_start;
    pVVar14 = (Var *)((long)(module->data_segments).
                            super__Vector_base<wabt::DataSegment_*,_std::allocator<wabt::DataSegment_*>_>
                            ._M_impl.super__Vector_impl_data._M_finish - (long)ppDVar8 >> 3);
    if (pVVar14 <= pVVar15) {
      applier.super_DelegateNop.super_Delegate._vptr_Delegate = (Delegate)(_func_int **)0x0;
      applier.labels_.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage._4_4_ = Ok;
      break;
    }
    pDVar9 = ppDVar8[(long)pVVar15];
    pVVar7 = &pDVar9->memory_var;
    pMVar13 = Module::GetMemory((Module *)applier.super_DelegateNop.super_Delegate._vptr_Delegate,
                                pVVar7);
    if (pMVar13 == (Memory *)0x0) break;
    name_00.size_ = (size_type)pVVar7;
    name_00.data_ = (char *)(pMVar13->name)._M_string_length;
    anon_unknown_7::NameApplier::UseNameForVar
              ((NameApplier *)(pMVar13->name)._M_dataplus._M_p,name_00,pVVar14);
    RVar10 = ExprVisitor::VisitExprList((ExprVisitor *)&applier.current_func_,&pDVar9->offset);
    pVVar15 = (Var *)((long)&(pVVar15->loc).filename.data_ + 1);
  } while (RVar10.enum_ != Error);
LAB_00d77f94:
  anon_unknown_7::NameApplier::~NameApplier((NameApplier *)local_d0);
  return (Result)applier.labels_.
                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_end_of_storage._4_4_;
}

Assistant:

Result ApplyNames(Module* module) {
  NameApplier applier;
  return applier.VisitModule(module);
}